

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::precisionReached(SPxSolverBase<double> *this,double *newpricertol)

{
  Verbosity VVar1;
  element_type *peVar2;
  SPxOut *manip;
  double *in_RSI;
  SPxSolverBase<double> *in_RDI;
  Real RVar3;
  double extraout_XMM0_Qa;
  Verbosity old_verbosity;
  bool reached;
  double sumViolConst;
  double maxViolConst;
  double sumViolBounds;
  double maxViolBounds;
  double sumViolRedCost;
  double maxViolRedCost;
  char *in_stack_ffffffffffffff88;
  SPxOut *in_stack_ffffffffffffff90;
  bool local_4d;
  undefined4 local_4c;
  Verbosity local_48;
  bool local_41;
  undefined1 local_40 [8];
  SPxOut *local_38;
  undefined1 local_30 [8];
  double local_28;
  undefined1 local_20 [8];
  double local_18;
  double *local_10;
  
  local_10 = in_RSI;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x72])(in_RDI,&local_18,local_20);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x70])(in_RDI,&local_28,local_30);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6f])(in_RDI,&local_38,local_40);
  tolerances(in_RDI);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x244b49);
  RVar3 = Tolerances::floatingPointOpttol(peVar2);
  local_4d = false;
  if (local_18 < RVar3) {
    tolerances(in_RDI);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x244b81);
    RVar3 = Tolerances::floatingPointFeastol(peVar2);
    local_4d = false;
    if (local_28 < RVar3) {
      tolerances(in_RDI);
      peVar2 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x244bb9);
      RVar3 = Tolerances::floatingPointFeastol(peVar2);
      local_4d = (double)local_38 < RVar3;
      in_stack_ffffffffffffff90 = local_38;
    }
  }
  local_41 = local_4d;
  if (local_4d == false) {
    (*in_RDI->thepricer->_vptr_SPxPricer[5])();
    *local_10 = extraout_XMM0_Qa / 10.0;
    if ((in_RDI->spxout != (SPxOut *)0x0) &&
       (VVar1 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar1)) {
      local_48 = SPxOut::getVerbosity(in_RDI->spxout);
      local_4c = 5;
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_4c);
      manip = soplex::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      (*in_RDI->thepricer->_vptr_SPxPricer[5])();
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(_func_ostream_ptr_ostream_ptr *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(_func_ostream_ptr_ostream_ptr *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(char *)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(double)manip);
      soplex::operator<<(in_stack_ffffffffffffff90,(_func_ostream_ptr_ostream_ptr *)manip);
      (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_48);
    }
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}